

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseDict
          (AsciiParser *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          *out_dict)

{
  uint8_t uVar1;
  StreamReader *pSVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  mapped_type *this_00;
  ulong uVar6;
  int iVar7;
  MetaVariable var;
  string key;
  ostringstream ss_e;
  storage_union local_220;
  undefined **local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  undefined8 local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  string local_1e8;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  bVar3 = Expect(this,'{');
  if ((bVar3) && (bVar3 = SkipCommentAndWhitespaceAndNewline(this,true), bVar3)) {
    do {
      pSVar2 = this->_sr;
      uVar6 = pSVar2->idx_;
      if ((pSVar2->length_ <= uVar6) || (pSVar2->binary_[uVar6] == '\0')) goto LAB_00338519;
      if (pSVar2->length_ < uVar6 + 1) {
LAB_00338198:
        iVar7 = 1;
      }
      else {
        uVar1 = pSVar2->binary_[uVar6];
        pSVar2->idx_ = uVar6 + 1;
        iVar7 = 3;
        if (uVar1 != '}') {
          uVar6 = pSVar2->idx_ - 1;
          if ((long)uVar6 < 0) goto LAB_00338198;
          iVar7 = 1;
          if (uVar6 <= pSVar2->length_) {
            pSVar2->idx_ = uVar6;
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            local_1c8._M_string_length = 0;
            local_1c8.field_2._M_local_buf[0] = '\0';
            local_210 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_220.dynamic = (void *)0x0;
            local_208 = &local_1f8;
            local_200 = 0;
            local_1f8._M_local_buf[0] = '\0';
            bVar3 = ParseDictElement(this,&local_1c8,(MetaVariable *)&local_220);
            if (bVar3) {
              iVar7 = 1;
              bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
              if (bVar3) {
                if ((local_210 == (undefined **)0x0) ||
                   (iVar4 = (*(code *)*local_210)(), iVar4 != 1)) {
                  this_00 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                            ::operator[](out_dict,&local_1c8);
                  ::std::__cxx11::string::_M_assign((string *)&this_00->_name);
                  linb::any::operator=((any *)this_00,(any *)&local_220);
                  iVar7 = 0;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_1a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"ParseDict",9);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3)
                  ;
                  poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x3ca);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"Invalid Dict element(probably internal issue).",
                             0x2e);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  PushError(this,&local_1e8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                    operator_delete(local_1e8._M_dataplus._M_p,
                                    local_1e8.field_2._M_allocated_capacity + 1);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
                  ::std::ios_base::~ios_base(local_138);
                }
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ParseDict",9);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar5 = (ostream *)::std::ostream::operator<<(local_1a8,0x3c2);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Failed to parse dict element.",0x1d);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              ::std::__cxx11::stringbuf::str();
              PushError(this,&local_1e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
              ::std::ios_base::~ios_base(local_138);
              iVar7 = 1;
            }
            if (local_208 != &local_1f8) {
              operator_delete(local_208,
                              CONCAT71(local_1f8._M_allocated_capacity._1_7_,
                                       local_1f8._M_local_buf[0]) + 1);
            }
            if (local_210 != (undefined **)0x0) {
              (*(code *)local_210[4])(&local_220);
              local_210 = (undefined **)0x0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,
                              CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                                       local_1c8.field_2._M_local_buf[0]) + 1);
            }
          }
        }
      }
    } while (iVar7 == 0);
    if (iVar7 != 1) {
LAB_00338519:
      bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseDict(std::map<std::string, MetaVariable> *out_dict) {
  // '{' comment | (type name '=' value)+ '}'
  if (!Expect('{')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '}') {
      break;
    } else {
      if (!Rewind(1)) {
        return false;
      }

      std::string key;
      MetaVariable var;
      if (!ParseDictElement(&key, &var)) {
        PUSH_ERROR_AND_RETURN("Failed to parse dict element.");
      }

      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      if (!var.is_valid()) {
        PUSH_ERROR_AND_RETURN("Invalid Dict element(probably internal issue).");
      }

      DCOUT("Add to dict: " << key);
      (*out_dict)[key] = var;
    }
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  return true;
}